

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int ffcalchist(long totalrows,long offset,long firstrow,long nrows,int ncols,iteratorCol *colpars,
              void *userPointer)

{
  int iVar1;
  int iVar2;
  iteratorCol *colData_00;
  double *pdVar3;
  double dVar4;
  long local_e8;
  long elem;
  int nCols;
  iteratorCol *colData;
  ParseStatusVariables *pv;
  iteratorCol *outcol;
  long lStack_b8;
  int startCol;
  long irow;
  long lStack_a8;
  int status;
  double *colptr [5];
  histType *histData;
  char *rowselect;
  double axisbin;
  double pix;
  long iaxisbin;
  long ipix;
  long ii;
  iteratorCol *colpars_local;
  int ncols_local;
  long nrows_local;
  long firstrow_local;
  long offset_local;
  long totalrows_local;
  
  memset(&stack0xffffffffffffff58,0,0x28);
  if (firstrow == 1) {
    *(undefined8 *)((long)userPointer + 0xf0) = *(undefined8 *)((long)userPointer + 0xe8);
  }
  histData = *(histType **)((long)userPointer + 0xf0);
  for (ipix = 0; ipix < 5; ipix = ipix + 1) {
    iVar1 = *(int *)((long)userPointer + ipix * 4 + 0x100);
    colptr[ipix + -1] = (double *)0x0;
    if (((ipix < *(int *)((long)userPointer + 0x10)) || (ipix == 4)) &&
       (-1 < *(int *)((long)userPointer + ipix * 4 + 0x100))) {
      if (*(int *)(*(long *)((long)userPointer + 0x120) + ipix * 0xe8 + 0x60) < 1) {
        pv = (ParseStatusVariables *)(*(long *)((long)userPointer + 0x118) + (long)iVar1 * 0x110);
      }
      else {
        colData_00 = (iteratorCol *)(*(long *)((long)userPointer + 0x118) + (long)iVar1 * 0x110);
        iVar1 = *(int *)(*(long *)((long)userPointer + 0x120) + ipix * 0xe8 + 0x60);
        iVar2 = fits_parser_workfn(totalrows,offset,firstrow,nrows,iVar1,colData_00,
                                   (void *)(*(long *)((long)userPointer + 0x128) + ipix * 0x90));
        if (iVar2 != 0) {
          return iVar2;
        }
        pv = (ParseStatusVariables *)(colData_00 + (iVar1 + -1));
      }
      if (pv != (ParseStatusVariables *)0x0) {
        pdVar3 = (double *)fits_iter_get_array((iteratorCol *)pv);
        colptr[ipix + -1] = pdVar3;
      }
    }
  }
  ipix = 1;
  lStack_b8 = 1;
  do {
    if (nrows < lStack_b8) {
      *(histType **)((long)userPointer + 0xf0) = histData;
      return 0;
    }
    if (histData == (histType *)0x0) {
LAB_002222b0:
      for (local_e8 = 1; local_e8 <= *(long *)((long)userPointer + 0xf8); local_e8 = local_e8 + 1) {
        dVar4 = *(double *)(lStack_a8 + ipix * 8);
        if (((dVar4 != -9.1191291391491e-36) || (NAN(dVar4))) &&
           ((colptr[3] == (double *)0x0 ||
            ((colptr[3][ipix] != -9.1191291391491e-36 || (NAN(colptr[3][ipix]))))))) {
          dVar4 = (*(double *)(lStack_a8 + ipix * 8) - *(double *)((long)userPointer + 0x48)) /
                  *(double *)((long)userPointer + 0x88);
          iaxisbin = (long)(dVar4 + 1.0);
          if ((0 < iaxisbin) &&
             ((iaxisbin <= *(long *)((long)userPointer + 0x28) &&
              (dVar4 < *(double *)((long)userPointer + 0x68) ||
               dVar4 == *(double *)((long)userPointer + 0x68))))) {
            if (*(int *)((long)userPointer + 0x10) < 2) goto LAB_00222596;
            if ((colptr[0][ipix] != -9.1191291391491e-36) || (NAN(colptr[0][ipix]))) {
              dVar4 = (colptr[0][ipix] - *(double *)((long)userPointer + 0x50)) /
                      *(double *)((long)userPointer + 0x90);
              if ((0.0 <= dVar4) &&
                 (((long)dVar4 < *(long *)((long)userPointer + 0x30) &&
                  (dVar4 < *(double *)((long)userPointer + 0x70) ||
                   dVar4 == *(double *)((long)userPointer + 0x70))))) {
                iaxisbin = (long)dVar4 * *(long *)((long)userPointer + 0xb0) + iaxisbin;
                if (*(int *)((long)userPointer + 0x10) < 3) goto LAB_00222596;
                if ((colptr[1][ipix] != -9.1191291391491e-36) || (NAN(colptr[1][ipix]))) {
                  dVar4 = (colptr[1][ipix] - *(double *)((long)userPointer + 0x58)) /
                          *(double *)((long)userPointer + 0x98);
                  if ((0.0 <= dVar4) &&
                     (((long)dVar4 < *(long *)((long)userPointer + 0x38) &&
                      (dVar4 < *(double *)((long)userPointer + 0x78) ||
                       dVar4 == *(double *)((long)userPointer + 0x78))))) {
                    iaxisbin = (long)dVar4 * *(long *)((long)userPointer + 0xb8) + iaxisbin;
                    if (*(int *)((long)userPointer + 0x10) < 4) {
LAB_00222596:
                      if ((*(double *)((long)userPointer + 0xe0) != -9.1191291391491e-36) ||
                         (NAN(*(double *)((long)userPointer + 0xe0)))) {
                        if (*(int *)((long)userPointer + 0x24) == 0x1f) {
                          *(int *)(*userPointer + iaxisbin * 4) =
                               (int)*(double *)((long)userPointer + 0xe0) +
                               *(int *)(*userPointer + iaxisbin * 4);
                        }
                        else if (*(int *)((long)userPointer + 0x24) == 0x15) {
                          *(short *)(*userPointer + iaxisbin * 2) =
                               *(short *)(*userPointer + iaxisbin * 2) +
                               (short)(int)*(double *)((long)userPointer + 0xe0);
                        }
                        else if (*(int *)((long)userPointer + 0x24) == 0x2a) {
                          *(float *)(*userPointer + iaxisbin * 4) =
                               (float)((double)*(float *)(*userPointer + iaxisbin * 4) +
                                      *(double *)((long)userPointer + 0xe0));
                        }
                        else if (*(int *)((long)userPointer + 0x24) == 0x52) {
                          *(double *)(*userPointer + iaxisbin * 8) =
                               *(double *)((long)userPointer + 0xe0) +
                               *(double *)(*userPointer + iaxisbin * 8);
                        }
                        else if (*(int *)((long)userPointer + 0x24) == 0xb) {
                          *(char *)(*userPointer + iaxisbin) =
                               *(char *)(*userPointer + iaxisbin) +
                               (char)(int)*(double *)((long)userPointer + 0xe0);
                        }
                      }
                      else if (*(int *)((long)userPointer + 0xd0) == 0) {
                        if (*(int *)((long)userPointer + 0x24) == 0x1f) {
                          *(int *)(*userPointer + iaxisbin * 4) =
                               (int)colptr[3][ipix] + *(int *)(*userPointer + iaxisbin * 4);
                        }
                        else if (*(int *)((long)userPointer + 0x24) == 0x15) {
                          *(short *)(*userPointer + iaxisbin * 2) =
                               *(short *)(*userPointer + iaxisbin * 2) + (short)(int)colptr[3][ipix]
                          ;
                        }
                        else if (*(int *)((long)userPointer + 0x24) == 0x2a) {
                          *(float *)(*userPointer + iaxisbin * 4) =
                               (float)((double)*(float *)(*userPointer + iaxisbin * 4) +
                                      colptr[3][ipix]);
                        }
                        else if (*(int *)((long)userPointer + 0x24) == 0x52) {
                          *(double *)(*userPointer + iaxisbin * 8) =
                               colptr[3][ipix] + *(double *)(*userPointer + iaxisbin * 8);
                        }
                        else if (*(int *)((long)userPointer + 0x24) == 0xb) {
                          *(char *)(*userPointer + iaxisbin) =
                               *(char *)(*userPointer + iaxisbin) + (char)(int)colptr[3][ipix];
                        }
                      }
                      else if (*(int *)((long)userPointer + 0x24) == 0x1f) {
                        *(int *)(*userPointer + iaxisbin * 4) =
                             (int)(1.0 / colptr[3][ipix]) + *(int *)(*userPointer + iaxisbin * 4);
                      }
                      else if (*(int *)((long)userPointer + 0x24) == 0x15) {
                        *(short *)(*userPointer + iaxisbin * 2) =
                             *(short *)(*userPointer + iaxisbin * 2) +
                             (short)(int)(1.0 / colptr[3][ipix]);
                      }
                      else if (*(int *)((long)userPointer + 0x24) == 0x2a) {
                        *(float *)(*userPointer + iaxisbin * 4) =
                             (float)(1.0 / colptr[3][ipix]) +
                             *(float *)(*userPointer + iaxisbin * 4);
                      }
                      else if (*(int *)((long)userPointer + 0x24) == 0x52) {
                        *(double *)(*userPointer + iaxisbin * 8) =
                             1.0 / colptr[3][ipix] + *(double *)(*userPointer + iaxisbin * 8);
                      }
                      else if (*(int *)((long)userPointer + 0x24) == 0xb) {
                        *(char *)(*userPointer + iaxisbin) =
                             *(char *)(*userPointer + iaxisbin) + (char)(int)(1.0 / colptr[3][ipix])
                        ;
                      }
                    }
                    else if ((colptr[2][ipix] != -9.1191291391491e-36) || (NAN(colptr[2][ipix]))) {
                      dVar4 = (colptr[2][ipix] - *(double *)((long)userPointer + 0x60)) /
                              *(double *)((long)userPointer + 0xa0);
                      if ((0.0 <= dVar4) &&
                         (((long)dVar4 < *(long *)((long)userPointer + 0x40) &&
                          (dVar4 < *(double *)((long)userPointer + 0x80) ||
                           dVar4 == *(double *)((long)userPointer + 0x80))))) {
                        iaxisbin = (long)dVar4 * *(long *)((long)userPointer + 0xc0) + iaxisbin;
                        goto LAB_00222596;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        ipix = ipix + 1;
      }
    }
    else {
      if (*(char *)&histData->hist != '\0') {
        histData = (histType *)((long)&histData->hist + 1);
        goto LAB_002222b0;
      }
      histData = (histType *)((long)&histData->hist + 1);
      ipix = *(long *)((long)userPointer + 0xf8) + ipix;
    }
    lStack_b8 = lStack_b8 + 1;
  } while( true );
}

Assistant:

int ffcalchist(long totalrows, long offset, long firstrow, long nrows,
             int ncols, iteratorCol *colpars, void *userPointer)
/*
   Interator work function that calculates values for the 2D histogram.
*/
{
    long ii, ipix, iaxisbin;
    double pix, axisbin;
    char *rowselect;
    histType *histData = (histType*)userPointer;
    double *colptr[MAXDIMS] = {0};
    int status = 0;
    long irow;

    if (firstrow == 1) {
      histData->rowselector_cur = histData->rowselector;
    }
    rowselect = histData->rowselector_cur;

    for (ii=0; ii<=4; ii++) {
      int startCol = histData->startCols[ii];
      iteratorCol *outcol = 0;
      /* Call calculator work function.  Result is put in final column of colData as a TemporaryCol */
      colptr[ii] = 0;

      /* Do not process unspecified axes (but do process weight column) */
      if ( (ii >= histData->haxis && ii != 4) || histData->startCols[ii] < 0) continue;

      /* We have a parser for this, evaluate it */
      if (histData->parsers[ii].nCols > 0) {
	struct ParseStatusVariables *pv = &(histData->infos[ii].parseVariables);
	iteratorCol *colData = &(histData->iterCols[startCol]);
	int nCols = histData->parsers[ii].nCols;

	status = fits_parser_workfn(totalrows, offset, firstrow, nrows, 
				    nCols, colData, (void *) &(histData->infos[ii]));
	if (status) return status;
	/* Output column is last iterator column, which better be a TemporaryCol */
	outcol = &(colData[nCols-1]);

      } else {
	outcol = &(histData->iterCols[startCol]);
      }

      if (outcol) {
	/* Note that the 0th array element returned by the iterator is
	   actually the null value!  This is actually rather a big
	   undocumented "feature" of the iterator. However, "ii" below
	   starts at a value of 1 which skips over the null value */
	colptr[ii] = ((double *) fits_iter_get_array(outcol));
      }
    }

    /*  Main loop over rows */
    /* irow = row counter (1 .. nrows) */
    /* elem = counter of element (1 .. histData->repeat) for each row */
    /* ii = counts up from 1 (see note below) used to index colptr[]'s */

    /* Note that ii starts at 1 because position [0] in the 
       column data arrays is for the "null" value! */
    for (ii = 1, irow = 1; irow <= nrows; irow++) 
    {
        long elem;
        if (rowselect) {    /* if a row selector array is supplied... */

	  if (*rowselect) {
               rowselect++;   /* this row is included in the histogram */

	  } else {
               rowselect++;   /* this row is excluded from the histogram */

	       ii += histData->repeat; /* skip this portion of data */
               continue;
           }
        }


	/* Loop over elements in each row, increment ii after each element */

        for (elem = 1; elem <= histData->repeat; elem++, ii++) {
	  if (colptr[0][ii] == DOUBLENULLVALUE)  /* test for null value */
            continue;
	  if (colptr[4] && colptr[4][ii] == DOUBLENULLVALUE) /* and null weight */
	    continue;
	  
	  pix = (colptr[0][ii] - histData->amin1) / histData->binsize1;
	  ipix = (long) (pix + 1.); /* add 1 because the 1st pixel is the null value */
	  
	  /* test if bin is within range */
	  if (ipix < 1 || ipix > histData->haxis1 || pix > histData->maxbin1)
            continue;
	  
	  if (histData->haxis > 1)
	    {
	      if (colptr[1][ii] == DOUBLENULLVALUE)
		continue;
	      
	      axisbin = (colptr[1][ii] - histData->amin2) / histData->binsize2;
	      iaxisbin = (long) axisbin;
	      
	      if (axisbin < 0. || iaxisbin >= histData->haxis2 || axisbin > histData->maxbin2)
		continue;
	      
	      ipix += (iaxisbin * histData->incr[1]);
	      
	      if (histData->haxis > 2)
		{
		  if (colptr[2][ii] == DOUBLENULLVALUE)
		    continue;
		  
		  axisbin = (colptr[2][ii] - histData->amin3) / histData->binsize3;
		  iaxisbin = (long) axisbin;
		  if (axisbin < 0. || iaxisbin >= histData->haxis3 || axisbin > histData->maxbin3)
		    continue;
		  
		  ipix += (iaxisbin * histData->incr[2]);
		  
		  if (histData->haxis > 3)
		    {
		      if (colptr[3][ii] == DOUBLENULLVALUE)
			continue;
		      
		      axisbin = (colptr[3][ii] - histData->amin4) / histData->binsize4;
		      iaxisbin = (long) axisbin;
		      if (axisbin < 0. || iaxisbin >= histData->haxis4 || axisbin > histData->maxbin4)
			continue;
		      
		      ipix += (iaxisbin * histData->incr[3]);
		      
		    }  /* end of haxis > 3 case */
		}    /* end of haxis > 2 case */
	    }      /* end of haxis > 1 case */

	  /* increment the histogram pixel */
	  if (histData->weight != DOUBLENULLVALUE) /* constant weight factor */
	    {   /* Note that if wtrecip == 1, the reciprocal was precomputed above */
	      if (histData->himagetype == TINT)
		histData->hist.j[ipix] += (int) histData->weight;
	      else if (histData->himagetype == TSHORT)
		histData->hist.i[ipix] += (short) histData->weight;
	      else if (histData->himagetype == TFLOAT)
		histData->hist.r[ipix] += histData->weight;
	      else if (histData->himagetype == TDOUBLE)
		histData->hist.d[ipix] += histData->weight;
	      else if (histData->himagetype == TBYTE)
		histData->hist.b[ipix] += (char) histData->weight;
	    }
	  else if (histData->wtrecip) /* use reciprocal of the weight */
	    {
	      if (histData->himagetype == TINT)
		histData->hist.j[ipix] += (int) (1./colptr[4][ii]);
	      else if (histData->himagetype == TSHORT)
		histData->hist.i[ipix] += (short) (1./colptr[4][ii]);
	      else if (histData->himagetype == TFLOAT)
		histData->hist.r[ipix] += (float) (1./colptr[4][ii]);
	      else if (histData->himagetype == TDOUBLE)
		histData->hist.d[ipix] += 1./colptr[4][ii];
	      else if (histData->himagetype == TBYTE)
		histData->hist.b[ipix] += (char) (1./colptr[4][ii]);
	    }
	  else   /* no weights */
	    {
	      if (histData->himagetype == TINT)
		histData->hist.j[ipix] += (int) colptr[4][ii];
	      else if (histData->himagetype == TSHORT)
		histData->hist.i[ipix] += (short) colptr[4][ii];
	      else if (histData->himagetype == TFLOAT)
		histData->hist.r[ipix] += colptr[4][ii];
	      else if (histData->himagetype == TDOUBLE)
		histData->hist.d[ipix] += colptr[4][ii];
	      else if (histData->himagetype == TBYTE)
		histData->hist.b[ipix] += (char) colptr[4][ii];
	    }

	} /* end of loop over elements per row */

    }  /* end of main loop over all rows */

    histData->rowselector_cur = rowselect; /* Save row pointer for next go-round */
    return(status);
}